

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Luna.cpp
# Opt level: O1

void ExecuteFile(char **argv,State *state)

{
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,argv[1],&local_39);
  luna::State::DoModule(state,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void ExecuteFile(const char **argv, luna::State &state)
{
    try
    {
        state.DoModule(argv[1]);
    }
    catch (const luna::OpenFileFail &exp)
    {
        printf("%s: can not open file %s\n", argv[0], exp.What().c_str());
    }
    catch (const luna::Exception &exp)
    {
        printf("%s\n", exp.What().c_str());
    }
}